

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yocto_obj.h
# Opt level: O0

void yo__add_env(yo_scene *scene,char *name,char *matname,yo__vert from,yo__vert to,yo__vec3f *pos,
                yo__vec3f *norm,yo__vhash *vhash)

{
  float fVar1;
  int iVar2;
  int iVar3;
  yo_env *pyVar4;
  char *pcVar5;
  yo__vec3f *pyVar6;
  yo__vec3f yVar7;
  int local_64;
  undefined8 uStack_60;
  int i;
  float local_58;
  undefined8 local_4c;
  float local_44;
  yo_env *env;
  yo__vhash *vhash_local;
  yo__vec3f *norm_local;
  yo__vec3f *pos_local;
  char *matname_local;
  char *name_local;
  yo_scene *scene_local;
  
  if (scene->nenvs != 0) {
    iVar2 = yo__vector_capacity(scene->nenvs + 1);
    iVar3 = yo__vector_capacity(scene->nenvs);
    if (iVar2 <= iVar3) goto LAB_001b2e11;
  }
  pyVar4 = scene->envs;
  iVar2 = yo__vector_capacity(scene->nenvs + 1);
  pyVar4 = (yo_env *)realloc(pyVar4,(long)iVar2 * 0x38);
  scene->envs = pyVar4;
  pyVar4 = scene->envs;
  iVar2 = scene->nenvs;
  iVar3 = yo__vector_capacity(scene->nenvs + 1);
  memset(pyVar4 + iVar2,0,(long)(iVar3 - scene->nenvs) * 0x38);
LAB_001b2e11:
  scene->nenvs = scene->nenvs + 1;
  pyVar4 = scene->envs;
  iVar2 = scene->nenvs;
  pcVar5 = yo__strdup(name);
  pyVar4[(long)iVar2 + -1].name = pcVar5;
  pcVar5 = yo__strdup(matname);
  pyVar4[(long)iVar2 + -1].matname = pcVar5;
  pyVar6 = pos + from.pos;
  fVar1 = pyVar6->y;
  pyVar4[(long)iVar2 + -1].from[0] = pyVar6->x;
  pyVar4[(long)iVar2 + -1].from[1] = fVar1;
  pyVar4[(long)iVar2 + -1].from[2] = pyVar6->z;
  pyVar6 = pos + to.pos;
  fVar1 = pyVar6->y;
  pyVar4[(long)iVar2 + -1].to[0] = pyVar6->x;
  pyVar4[(long)iVar2 + -1].to[1] = fVar1;
  pyVar4[(long)iVar2 + -1].to[2] = pyVar6->z;
  if (from.norm < 0) {
    yVar7 = yo__v3(0.0,1.0,0.0);
    uStack_60 = yVar7._0_8_;
    local_4c = uStack_60;
    local_58 = yVar7.z;
    local_44 = local_58;
  }
  else {
    pyVar6 = norm + from.norm;
    local_4c._0_4_ = pyVar6->x;
    local_4c._4_4_ = pyVar6->y;
    local_44 = pyVar6->z;
  }
  *(undefined8 *)pyVar4[(long)iVar2 + -1].up = local_4c;
  pyVar4[(long)iVar2 + -1].up[2] = local_44;
  vhash->nverts = 0;
  for (local_64 = 0; local_64 < 0x100000; local_64 = local_64 + 1) {
    vhash->s[local_64] = 0;
  }
  return;
}

Assistant:

static inline void
yo__add_env(yo_scene* scene, const char* name, const char* matname,
            yo__vert from, yo__vert to, yo__vec3f* pos, yo__vec3f* norm,
            yo__vhash* vhash) {
    yo__vector_grow(yo_env, scene->envs, scene->nenvs, 1);
    yo_env* env = scene->envs + scene->nenvs - 1;

    env->name = yo__strdup(name);
    env->matname = yo__strdup(matname);
    *(yo__vec3f*)env->from = pos[from.pos];
    *(yo__vec3f*)env->to = pos[to.pos];
    *(yo__vec3f*)env->up =
        (from.norm >= 0) ? norm[from.norm] : yo__v3(0, 1, 0);

    // clear buffers
    vhash->nverts = 0;
    for (int i = 0; i < yo__vhash_size; i++) vhash->s[i] = 0;
}